

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O1

void __thiscall Sap_Apu::run_until(Sap_Apu *this,blip_time_t end_time)

{
  uchar *puVar1;
  int iVar2;
  Sap_Apu_Impl *this_00;
  Blip_Buffer *buf;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  int *piVar10;
  int i;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  Sap_Apu *pSVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  blip_time_t bVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  int local_a0;
  int local_9c;
  byte_ *local_60;
  
  uVar17 = this->control;
  iVar7 = 0x72;
  if ((uVar17 & 1) == 0) {
    iVar7 = 0x1c;
  }
  uVar12 = 0;
  pSVar15 = this;
  do {
    bVar9 = pSVar15->oscs[0].regs[0];
    if ((uVar17 & (byte)(&calc_periods()::fast_bits)[uVar12]) == 0) {
      iVar6 = (bVar9 + 1) * iVar7;
    }
    else if ((uVar12 & 1) == 0) {
      iVar6 = bVar9 + 4;
    }
    else {
      iVar14 = (uint)bVar9 * 0x100;
      uVar21 = (uint)(byte)pSVar15[-1].last_time;
      iVar6 = (iVar14 + uVar21 + 1) * iVar7;
      if ((uVar17 & "UU"[uVar12 + 1]) != 0) {
        iVar6 = iVar14 + uVar21 + 7;
      }
    }
    pSVar15->oscs[0].period = iVar6;
    uVar12 = uVar12 + 1;
    pSVar15 = (Sap_Apu *)(pSVar15->oscs + 1);
  } while (uVar12 != 4);
  this_00 = this->impl;
  bVar24 = -1 < (char)uVar17;
  iVar7 = 0x1ff;
  if (bVar24) {
    iVar7 = 0x1ffff;
  }
  this->polym_pos = this->polym_pos % iVar7;
  lVar22 = 0;
  do {
    iVar14 = this->last_time;
    iVar11 = this->oscs[lVar22].delay;
    iVar2 = this->oscs[lVar22].period;
    iVar6 = iVar11 + iVar14;
    buf = this->oscs[lVar22].output;
    if (buf != (Blip_Buffer *)0x0) {
      buf->modified_ = 1;
      bVar9 = this->oscs[lVar22].regs[1];
      uVar17 = (uint)bVar9 + (uint)bVar9 & 0x1e;
      bVar8 = (byte)((bVar9 & 0x10) >> 4);
      if ((uVar17 == 0 || bVar8 != 0) || (iVar2 < 0x4a && (~bVar9 & 0xa0) == 0)) {
        uVar17 = uVar17 >> (bVar8 ^ 1);
        iVar11 = uVar17 - this->oscs[lVar22].last_amp;
        if (iVar11 != 0) {
          this->oscs[lVar22].last_amp = uVar17;
          Blip_Synth<12,_1>::offset(&this_00->synth,iVar14,iVar11,buf);
        }
      }
      else {
        if ((this->control & (uint)"\x04\x02"[lVar22]) == 0) {
          local_a0 = 0;
          iVar14 = end_time;
        }
        else {
          local_a0 = this->oscs[lVar22 + 2].period;
          iVar14 = iVar14 + this->oscs[lVar22 + 2].delay;
          if (this->oscs[lVar22].invert != '\0') {
            piVar10 = &this->oscs[lVar22].last_amp;
            *piVar10 = *piVar10 - uVar17;
            uVar17 = -uVar17;
          }
        }
        if (iVar14 < end_time || iVar6 < end_time) {
          if ((bVar9 & 0x20) == 0) {
            bVar23 = (bVar9 & 0x40) == 0;
            uVar12 = 0x330;
            if (bVar23) {
              uVar12 = (ulong)bVar24 << 6 | 0x332;
            }
            piVar10 = &this->poly4_pos;
            iVar16 = 0xf;
            if (bVar23) {
              piVar10 = &this->polym_pos;
              iVar16 = iVar7;
            }
            local_60 = (byte_ *)((long)(this_00->synth).impulses + (uVar12 - 0x28));
            local_9c = iVar2 % iVar16;
            uVar12 = (long)(*piVar10 + iVar11) % (long)iVar16 & 0xffffffff;
          }
          else {
            uVar12 = (ulong)(this->oscs[lVar22].phase & 1);
            local_9c = 1;
            iVar16 = 0x10;
            local_60 = "UU";
          }
          if ((char)bVar9 < '\0') {
            bVar9 = 0;
            uVar21 = 0x167c6ea1;
          }
          else {
            iVar11 = iVar11 + this->poly5_pos;
            bVar9 = ((char)(uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) -
                    (char)(iVar11 >> 0x1f)) * -0x1f + (char)iVar11;
            uVar21 = 0x167c6ea1U >> (~bVar9 & 0x1f) | 0x167c6ea1 << (bVar9 & 0x1f) & 0x7fffffffU;
            bVar9 = (byte)(iVar2 % 0x1f);
          }
          uVar19 = this->oscs[lVar22].last_amp;
          do {
            if (iVar14 < iVar6) {
              uVar18 = (int)uVar17 >> 0x1f & uVar17;
              iVar11 = uVar18 - uVar19;
              if (iVar11 != 0) {
                uVar19 = uVar18 - uVar17;
                uVar17 = -uVar17;
                Blip_Synth<12,_1>::offset(&this_00->synth,iVar14,iVar11,buf);
              }
            }
            iVar4 = iVar6 + 1;
            iVar11 = iVar4;
            if (iVar4 < iVar14) {
              iVar11 = iVar14;
            }
            iVar14 = iVar14 + (((iVar11 - iVar14) - (uint)(iVar14 < iVar4)) /
                               (local_a0 + (uint)(local_a0 == 0)) + (uint)(iVar14 < iVar4)) *
                              local_a0;
            bVar20 = end_time;
            if (iVar14 < end_time) {
              bVar20 = iVar14;
            }
            if (iVar6 < end_time) {
              do {
                if ((uVar21 & 1) != 0) {
                  uVar13 = (uint)uVar12;
                  uVar18 = 0;
                  if ((local_60[(int)uVar13 >> 3] >> (uVar13 & 7) & 1) != 0) {
                    uVar18 = uVar17;
                  }
                  uVar5 = (local_9c - iVar16) + uVar13;
                  uVar13 = uVar13 + local_9c;
                  if (-1 < (int)uVar5) {
                    uVar13 = uVar5;
                  }
                  uVar12 = (ulong)uVar13;
                  if (uVar18 - uVar19 != 0) {
                    Blip_Synth<12,_1>::offset(&this_00->synth,iVar6,uVar18 - uVar19,buf);
                    uVar19 = uVar18;
                  }
                }
                uVar21 = uVar21 >> (0x1f - bVar9 & 0x1f) | uVar21 << (bVar9 & 0x1f) & 0x7fffffff;
                iVar6 = iVar6 + iVar2;
              } while (iVar6 < bVar20);
            }
          } while ((iVar14 < end_time) || (iVar6 < end_time));
          this->oscs[lVar22].phase = (uchar)uVar12;
          this->oscs[lVar22].last_amp = uVar19;
        }
        this->oscs[lVar22].invert = '\0';
        if ((int)uVar17 < 0) {
          piVar10 = &this->oscs[lVar22].last_amp;
          *piVar10 = *piVar10 - uVar17;
          this->oscs[lVar22].invert = '\x01';
        }
      }
    }
    if (end_time - iVar6 != 0 && iVar6 <= end_time) {
      lVar3 = (long)((end_time - iVar6) + iVar2 + -1) / (long)iVar2;
      puVar1 = &this->oscs[lVar22].phase;
      *puVar1 = *puVar1 ^ (byte)lVar3;
      iVar6 = (int)lVar3 * iVar2 + iVar6;
    }
    this->oscs[lVar22].delay = iVar6 - end_time;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  iVar7 = end_time - this->last_time;
  this->last_time = end_time;
  this->poly4_pos = (this->poly4_pos + iVar7) % 0xf;
  this->poly5_pos = (this->poly5_pos + iVar7) % 0x1f;
  this->polym_pos = this->polym_pos + iVar7;
  return;
}

Assistant:

void Sap_Apu::run_until( blip_time_t end_time )
{
	calc_periods();
	Sap_Apu_Impl* const impl = this->impl; // cache
	
	// 17/9-bit poly selection
	byte const* polym = impl->poly17;
	int polym_len = poly17_len;
	if ( this->control & 0x80 )
	{
		polym_len = poly9_len;
		polym = impl->poly9;
	}
	polym_pos %= polym_len;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		osc_t* const osc = &oscs [i];
		blip_time_t time = last_time + osc->delay;
		blip_time_t const period = osc->period;
		
		// output
		Blip_Buffer* output = osc->output;
		if ( output )
		{
			output->set_modified();
			
			int const osc_control = osc->regs [1]; // cache
			int volume = (osc_control & 0x0F) * 2;
			if ( !volume || osc_control & 0x10 || // silent, DAC mode, or inaudible frequency
					((osc_control & 0xA0) == 0xA0 && period < 1789773 / 2 / max_frequency) )
			{
				if ( !(osc_control & 0x10) )
					volume >>= 1; // inaudible frequency = half volume
				
				int delta = volume - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = volume;
					impl->synth.offset( last_time, delta, output );
				}
				
				// TODO: doesn't maintain high pass flip-flop (very minor issue)
			}
			else
			{
				// high pass
				static byte const hipass_bits [osc_count] = { 1 << 2, 1 << 1, 0, 0 };
				blip_time_t period2 = 0; // unused if no high pass
				blip_time_t time2 = end_time;
				if ( this->control & hipass_bits [i] )
				{
					period2 = osc [2].period;
					time2 = last_time + osc [2].delay;
					if ( osc->invert )
					{
						// trick inner wave loop into inverting output
						osc->last_amp -= volume;
						volume = -volume;
					}
				}
				
				if ( time < end_time || time2 < end_time )
				{
					// poly source
					static byte const poly1 [] = { 0x55, 0x55 }; // square wave
					byte const* poly = poly1;
					int poly_len = 8 * sizeof poly1; // can be just 2 bits, but this is faster
					int poly_pos = osc->phase & 1;
					int poly_inc = 1;
					if ( !(osc_control & 0x20) )
					{
						poly     = polym;
						poly_len = polym_len;
						poly_pos = polym_pos;
						if ( osc_control & 0x40 )
						{
							poly     = impl->poly4;
							poly_len = poly4_len;
							poly_pos = poly4_pos;
						}
						poly_inc = period % poly_len;
						poly_pos = (poly_pos + osc->delay) % poly_len;
					}
					poly_inc -= poly_len; // allows more optimized inner loop below
					
					// square/poly5 wave
					blargg_ulong wave = poly5;
					check( poly5 & 1 ); // low bit is set for pure wave
					int poly5_inc = 0;
					if ( !(osc_control & 0x80) )
					{
						wave = run_poly5( wave, (osc->delay + poly5_pos) % poly5_len );
						poly5_inc = period % poly5_len;
					}
					
					// Run wave and high pass interleved with each catching up to the other.
					// Disabled high pass has no performance effect since inner wave loop
					// makes no compromise for high pass, and only runs once in that case.
					int osc_last_amp = osc->last_amp;
					do
					{
						// run high pass
						if ( time2 < time )
						{
							int delta = -osc_last_amp;
							if ( volume < 0 )
								delta += volume;
							if ( delta )
							{
								osc_last_amp += delta - volume;
								volume = -volume;
								impl->synth.offset( time2, delta, output );
							}
						}
						while ( time2 <= time ) // must advance *past* time to avoid hang
							time2 += period2;
						
						// run wave
						blip_time_t end = end_time;
						if ( end > time2 )
							end = time2;
						while ( time < end )
						{
							if ( wave & 1 )
							{
								int amp = volume & -(poly [poly_pos >> 3] >> (poly_pos & 7) & 1);
								if ( (poly_pos += poly_inc) < 0 )
									poly_pos += poly_len;
								int delta = amp - osc_last_amp;
								if ( delta )
								{
									osc_last_amp = amp;
									impl->synth.offset( time, delta, output );
								}
							}
							wave = run_poly5( wave, poly5_inc );
							time += period;
						}
					}
					while ( time < end_time || time2 < end_time );
					
					osc->phase = poly_pos;
					osc->last_amp = osc_last_amp;
				}
				
				osc->invert = 0;
				if ( volume < 0 )
				{
					// undo inversion trickery
					osc->last_amp -= volume;
					osc->invert = 1;
				}
			}
		}
		
		// maintain divider
		blip_time_t remain = end_time - time;
		if ( remain > 0 )
		{
			blargg_long count = (remain + period - 1) / period;
			osc->phase ^= count;
			time += count * period;
		}
		osc->delay = time - end_time;
	}
	
	// advance polies
	blip_time_t duration = end_time - last_time;
	last_time = end_time;
	poly4_pos = (poly4_pos + duration) % poly4_len;
	poly5_pos = (poly5_pos + duration) % poly5_len;
	polym_pos += duration; // will get %'d on next call
}